

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Document::ReadObjects(Document *this)

{
  bool bVar1;
  int iVar2;
  Element *pEVar3;
  Scope *pSVar4;
  LazyObject *pLVar5;
  mapped_type *ppLVar6;
  ElementMap *this_00;
  const_reference ppTVar7;
  char *__s1;
  allocator<char> local_171;
  string local_170;
  _Self local_150;
  _Self local_148;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  uint64_t local_f0;
  uint64_t id;
  char *err;
  string local_d8;
  vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *local_b8;
  TokenList *tok;
  value_type *el;
  const_iterator __end2;
  const_iterator __begin2;
  ElementMap *__range2;
  Scope *sobjects;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  Element *local_20;
  Element *eobjects;
  Scope *sc;
  Document *this_local;
  
  sc = (Scope *)this;
  pEVar3 = (Element *)Parser::GetRootScope(this->parser);
  eobjects = pEVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Objects",&local_41);
  pEVar3 = Scope::operator[]((Scope *)pEVar3,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = pEVar3;
  if ((pEVar3 == (Element *)0x0) || (pSVar4 = Element::Compound(pEVar3), pSVar4 == (Scope *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"no Objects dictionary found",&local_79);
    Util::DOMError(&local_78,(Element *)0x0);
  }
  pLVar5 = (LazyObject *)operator_new(0x28);
  LazyObject::LazyObject(pLVar5,0,local_20,this);
  sobjects = (Scope *)0x0;
  ppLVar6 = std::
            map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
            ::operator[](&this->objects,(key_type_conflict1 *)&sobjects);
  *ppLVar6 = pLVar5;
  pSVar4 = Element::Compound(local_20);
  this_00 = Scope::Elements_abi_cxx11_(pSVar4);
  __end2 = std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
           ::begin(this_00);
  el = (value_type *)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&el);
    if (!bVar1) {
      return;
    }
    tok = (TokenList *)
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
          ::operator*(&__end2);
    local_b8 = Element::Tokens(((reference)tok)->second);
    bVar1 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
            empty(local_b8);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"expected ID after object key",
                 (allocator<char> *)((long)&err + 7));
      Util::DOMError(&local_d8,
                     (Element *)
                     tok[1].
                     super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
    }
    ppTVar7 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[](local_b8,0);
    local_f0 = ParseTokenAsID(*ppTVar7,(char **)&id);
    if (id != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,(char *)id,&local_111)
      ;
      Util::DOMError(&local_110,
                     (Element *)
                     tok[1].
                     super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_f0 == 0) break;
    local_148._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
         ::find(&this->objects,&local_f0);
    local_150._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
         ::end(&this->objects);
    bVar1 = std::operator!=(&local_148,&local_150);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"encountered duplicate object id, ignoring first occurrence",
                 &local_171);
      Util::DOMWarning(&local_170,
                       (Element *)
                       tok[1].
                       super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
    }
    pLVar5 = (LazyObject *)operator_new(0x28);
    LazyObject::LazyObject
              (pLVar5,local_f0,
               (Element *)
               tok[1].
               super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,this);
    ppLVar6 = std::
              map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
              ::operator[](&this->objects,&local_f0);
    *ppLVar6 = pLVar5;
    __s1 = (char *)std::__cxx11::string::c_str();
    iVar2 = strcmp(__s1,"AnimationStack");
    if (iVar2 == 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->animationStacks,&local_f0);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
    ::operator++(&__end2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"encountered object with implicitly defined id 0",&local_139);
  Util::DOMError(&local_138,
                 (Element *)
                 tok[1].
                 super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
}

Assistant:

void Document::ReadObjects()
{
    // read ID objects from "Objects" section
    const Scope& sc = parser.GetRootScope();
    const Element* const eobjects = sc["Objects"];
    if(!eobjects || !eobjects->Compound()) {
        DOMError("no Objects dictionary found");
    }

    // add a dummy entry to represent the Model::RootNode object (id 0),
    // which is only indirectly defined in the input file
    objects[0] = new LazyObject(0L, *eobjects, *this);

    const Scope& sobjects = *eobjects->Compound();
    for(const ElementMap::value_type& el : sobjects.Elements()) {

        // extract ID
        const TokenList& tok = el.second->Tokens();

        if (tok.empty()) {
            DOMError("expected ID after object key",el.second);
        }

        const char* err;
        const uint64_t id = ParseTokenAsID(*tok[0], err);
        if(err) {
            DOMError(err,el.second);
        }

        // id=0 is normally implicit
        if(id == 0L) {
            DOMError("encountered object with implicitly defined id 0",el.second);
        }

        if(objects.find(id) != objects.end()) {
            DOMWarning("encountered duplicate object id, ignoring first occurrence",el.second);
        }

        objects[id] = new LazyObject(id, *el.second, *this);

        // grab all animation stacks upfront since there is no listing of them
        if(!strcmp(el.first.c_str(),"AnimationStack")) {
            animationStacks.push_back(id);
        }
    }
}